

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int do_flush(gzFile file,int flush)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  int local_38;
  gz_stream *s;
  int done;
  uInt len;
  int flush_local;
  gzFile file_local;
  
  bVar4 = false;
  if ((file == (gzFile)0x0) || (*(char *)((long)file + 0xac) != 'w')) {
    file_local._4_4_ = -2;
  }
  else {
    *(undefined4 *)((long)file + 8) = 0;
    do {
      uVar1 = 0x4000 - *(int *)((long)file + 0x20);
      if (uVar1 != 0) {
        sVar3 = fwrite(*(void **)((long)file + 0x88),1,(ulong)uVar1,*(FILE **)((long)file + 0x78));
        if ((uint)sVar3 != uVar1) {
          *(undefined4 *)((long)file + 0x70) = 0xffffffff;
          return -1;
        }
        *(undefined8 *)((long)file + 0x18) = *(undefined8 *)((long)file + 0x88);
        *(undefined4 *)((long)file + 0x20) = 0x4000;
      }
      if (bVar4) break;
      *(ulong *)((long)file + 0xc0) =
           (ulong)*(uint *)((long)file + 0x20) + *(long *)((long)file + 0xc0);
      iVar2 = cm_zlib_deflate((z_streamp)file,flush);
      *(int *)((long)file + 0x70) = iVar2;
      *(ulong *)((long)file + 0xc0) =
           *(long *)((long)file + 0xc0) - (ulong)*(uint *)((long)file + 0x20);
      if ((uVar1 == 0) && (*(int *)((long)file + 0x70) == -5)) {
        *(undefined4 *)((long)file + 0x70) = 0;
      }
      bVar4 = true;
      if (*(int *)((long)file + 0x20) == 0) {
        bVar4 = *(int *)((long)file + 0x70) == 1;
      }
    } while ((*(int *)((long)file + 0x70) == 0) || (*(int *)((long)file + 0x70) == 1));
    if (*(int *)((long)file + 0x70) == 1) {
      local_38 = 0;
    }
    else {
      local_38 = *(int *)((long)file + 0x70);
    }
    file_local._4_4_ = local_38;
  }
  return file_local._4_4_;
}

Assistant:

local int do_flush (file, flush)
    gzFile file;
    int flush;
{
    uInt len;
    int done = 0;
    gz_stream *s = (gz_stream*)file;

    if (s == NULL || s->mode != 'w') return Z_STREAM_ERROR;

    s->stream.avail_in = 0; /* should be zero already anyway */

    for (;;) {
        len = Z_BUFSIZE - s->stream.avail_out;

        if (len != 0) {
            if ((uInt)fwrite(s->outbuf, 1, len, s->file) != len) {
                s->z_err = Z_ERRNO;
                return Z_ERRNO;
            }
            s->stream.next_out = s->outbuf;
            s->stream.avail_out = Z_BUFSIZE;
        }
        if (done) break;
        s->out += s->stream.avail_out;
        s->z_err = deflate(&(s->stream), flush);
        s->out -= s->stream.avail_out;

        /* Ignore the second of two consecutive flushes: */
        if (len == 0 && s->z_err == Z_BUF_ERROR) s->z_err = Z_OK;

        /* deflate has finished flushing only when it hasn't used up
         * all the available space in the output buffer:
         */
        done = (s->stream.avail_out != 0 || s->z_err == Z_STREAM_END);

        if (s->z_err != Z_OK && s->z_err != Z_STREAM_END) break;
    }
    return  s->z_err == Z_STREAM_END ? Z_OK : s->z_err;
}